

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_dec.c
# Opt level: O1

int EmitFancyRGB(VP8Io *io,WebPDecParams *p)

{
  int iVar1;
  int iVar2;
  WebPDecBuffer *pWVar3;
  WebPUpsampleLinePairFunc p_Var4;
  int iVar5;
  long lVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  size_t __n;
  uint8_t *__src;
  uint uVar9;
  uint8_t *puVar10;
  uint8_t *__src_00;
  int iVar11;
  uint8_t *puVar12;
  
  iVar1 = io->mb_h;
  pWVar3 = p->output;
  iVar11 = io->mb_y;
  lVar6 = (long)(pWVar3->u).RGBA.stride;
  puVar12 = (pWVar3->u).RGBA.rgba + lVar6 * iVar11;
  iVar2 = io->mb_w;
  p_Var4 = WebPUpsamplers[pWVar3->colorspace];
  puVar10 = io->y;
  __src = io->u;
  __src_00 = io->v;
  if ((long)iVar11 == 0) {
    (*p_Var4)(puVar10,(uint8_t *)0x0,__src,__src_00,__src,__src_00,puVar12,(uint8_t *)0x0,iVar2);
    iVar5 = iVar1;
  }
  else {
    (*p_Var4)(p->tmp_y,puVar10,p->tmp_u,p->tmp_v,__src,__src_00,puVar12 + -lVar6,puVar12,iVar2);
    iVar5 = iVar1 + 1;
  }
  uVar9 = iVar11 + iVar1;
  if (2 < iVar1) {
    iVar11 = iVar11 + 2;
    puVar7 = __src_00;
    puVar8 = __src;
    do {
      __src = puVar8 + io->uv_stride;
      __src_00 = puVar7 + io->uv_stride;
      lVar6 = (long)(pWVar3->u).RGBA.stride;
      puVar12 = puVar12 + lVar6 * 2;
      puVar10 = puVar10 + (long)io->y_stride * 2;
      (*p_Var4)(puVar10 + -(long)io->y_stride,puVar10,puVar8,puVar7,__src,__src_00,puVar12 + -lVar6,
                puVar12,iVar2);
      iVar11 = iVar11 + 2;
      puVar7 = __src_00;
      puVar8 = __src;
    } while (iVar11 < (int)uVar9);
  }
  if ((int)(io->crop_top + uVar9) < io->crop_bottom) {
    memcpy(p->tmp_y,puVar10 + io->y_stride,(long)iVar2);
    __n = (size_t)((iVar2 - (iVar2 + 1 >> 0x1f)) + 1 >> 1);
    memcpy(p->tmp_u,__src,__n);
    memcpy(p->tmp_v,__src_00,__n);
    iVar5 = iVar5 + -1;
  }
  else if ((uVar9 & 1) == 0) {
    (*p_Var4)(puVar10 + io->y_stride,(uint8_t *)0x0,__src,__src_00,__src,__src_00,
              puVar12 + (pWVar3->u).RGBA.stride,(uint8_t *)0x0,iVar2);
  }
  return iVar5;
}

Assistant:

static int EmitFancyRGB(const VP8Io* const io, WebPDecParams* const p) {
  int num_lines_out = io->mb_h;   // a priori guess
  const WebPRGBABuffer* const buf = &p->output->u.RGBA;
  uint8_t* dst = buf->rgba + (size_t)io->mb_y * buf->stride;
  WebPUpsampleLinePairFunc upsample = WebPUpsamplers[p->output->colorspace];
  const uint8_t* cur_y = io->y;
  const uint8_t* cur_u = io->u;
  const uint8_t* cur_v = io->v;
  const uint8_t* top_u = p->tmp_u;
  const uint8_t* top_v = p->tmp_v;
  int y = io->mb_y;
  const int y_end = io->mb_y + io->mb_h;
  const int mb_w = io->mb_w;
  const int uv_w = (mb_w + 1) / 2;

  if (y == 0) {
    // First line is special cased. We mirror the u/v samples at boundary.
    upsample(cur_y, NULL, cur_u, cur_v, cur_u, cur_v, dst, NULL, mb_w);
  } else {
    // We can finish the left-over line from previous call.
    upsample(p->tmp_y, cur_y, top_u, top_v, cur_u, cur_v,
             dst - buf->stride, dst, mb_w);
    ++num_lines_out;
  }
  // Loop over each output pairs of row.
  for (; y + 2 < y_end; y += 2) {
    top_u = cur_u;
    top_v = cur_v;
    cur_u += io->uv_stride;
    cur_v += io->uv_stride;
    dst += 2 * buf->stride;
    cur_y += 2 * io->y_stride;
    upsample(cur_y - io->y_stride, cur_y,
             top_u, top_v, cur_u, cur_v,
             dst - buf->stride, dst, mb_w);
  }
  // move to last row
  cur_y += io->y_stride;
  if (io->crop_top + y_end < io->crop_bottom) {
    // Save the unfinished samples for next call (as we're not done yet).
    memcpy(p->tmp_y, cur_y, mb_w * sizeof(*p->tmp_y));
    memcpy(p->tmp_u, cur_u, uv_w * sizeof(*p->tmp_u));
    memcpy(p->tmp_v, cur_v, uv_w * sizeof(*p->tmp_v));
    // The fancy upsampler leaves a row unfinished behind
    // (except for the very last row)
    num_lines_out--;
  } else {
    // Process the very last row of even-sized picture
    if (!(y_end & 1)) {
      upsample(cur_y, NULL, cur_u, cur_v, cur_u, cur_v,
               dst + buf->stride, NULL, mb_w);
    }
  }
  return num_lines_out;
}